

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O3

assetsys_error_t
assetsys_mount(assetsys_t *sys,char *path,char *zip_mem,size_t zip_mem_size,char *mount_as)

{
  mz_zip_archive *pZip;
  strpool_t *pool;
  mz_uint mVar1;
  assetsys_internal_mount_t *paVar2;
  bool bVar3;
  int iVar4;
  mz_bool mVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  assetsys_internal_mount_t *__dest;
  unsigned_long_long uVar9;
  assetsys_internal_file_t *paVar10;
  assetsys_internal_folder_t *paVar11;
  assetsys_internal_folder_t *__dest_00;
  strpool_internal_entry_t *psVar12;
  assetsys_internal_file_t *__dest_01;
  mz_uint mVar13;
  long lVar14;
  char *path_00;
  long lVar15;
  stat s;
  assetsys_internal_mount_type_t local_448;
  mz_zip_archive_file_stat local_438;
  
  if (mount_as == (char *)0x0 || path == (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  pcVar7 = strchr(path,0x5c);
  if (pcVar7 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  pcVar7 = strchr(mount_as,0x3a);
  if (pcVar7 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  pcVar7 = strchr(mount_as,0x5c);
  if (pcVar7 != (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  sVar8 = strlen(path);
  iVar4 = (int)sVar8;
  if (0 < iVar4) {
    if (*path == '/') {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
    if ((iVar4 != 1) && (path[iVar4 - 1] == '/')) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
  }
  sVar8 = strlen(mount_as);
  iVar4 = (int)sVar8;
  if (iVar4 == 0) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  if (*mount_as != '/') {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  if ((1 < iVar4) && (mount_as[iVar4 - 1] == '/')) {
    return ASSETSYS_ERROR_INVALID_PATH;
  }
  local_448 = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
  if (zip_mem == (char *)0x0) {
    pcVar7 = ".";
    if (*path != '\0') {
      pcVar7 = path;
    }
    iVar4 = stat(pcVar7,(stat *)&local_438);
    if (iVar4 != 0) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
    if ((local_438.m_crc32 >> 0xe & 1) != 0) {
      local_448 = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
      bVar3 = true;
      goto LAB_00171010;
    }
    if (-1 < (short)local_438.m_crc32) {
      return ASSETSYS_ERROR_INVALID_PATH;
    }
  }
  bVar3 = false;
LAB_00171010:
  iVar4 = sys->mounts_count;
  iVar6 = sys->mounts_capacity;
  if (iVar4 < iVar6) {
    __dest = sys->mounts;
  }
  else {
    sys->mounts_capacity = iVar6 * 2;
    __dest = (assetsys_internal_mount_t *)malloc((long)iVar6 * 0x130);
    paVar2 = sys->mounts;
    memcpy(__dest,paVar2,(long)iVar4 * 0x98);
    free(paVar2);
    sys->mounts = __dest;
    iVar4 = sys->mounts_count;
  }
  paVar2 = __dest + iVar4;
  uVar9 = assetsys_internal_add_string(sys,mount_as);
  __dest[iVar4].mounted_as = uVar9;
  sVar8 = strlen(mount_as);
  __dest[iVar4].mount_len = (int)sVar8;
  uVar9 = assetsys_internal_add_string(sys,path);
  __dest[iVar4].path = uVar9;
  __dest[iVar4].type = local_448;
  __dest[iVar4].files_count = 0;
  __dest[iVar4].files_capacity = 0x1000;
  paVar10 = (assetsys_internal_file_t *)malloc(0xc000);
  __dest[iVar4].files = paVar10;
  __dest[iVar4].dirs_capacity = 0x400;
  paVar11 = (assetsys_internal_folder_t *)malloc(0x1000);
  __dest[iVar4].dirs = paVar11;
  __dest[iVar4].dirs_count = 1;
  iVar4 = assetsys_internal_register_collated(sys,mount_as,0);
  paVar11->collated_index = iVar4;
  if (bVar3) {
    assetsys_internal_recurse_directories(sys,iVar4,paVar2);
  }
  else {
    pZip = &paVar2->zip;
    (paVar2->zip).m_pAlloc = (mz_alloc_func)0x0;
    (paVar2->zip).m_pFree = (mz_free_func)0x0;
    (paVar2->zip).m_pRealloc = (mz_realloc_func)0x0;
    (paVar2->zip).m_pAlloc_opaque = (void *)0x0;
    (paVar2->zip).m_pIO_opaque = (void *)0x0;
    (paVar2->zip).m_pState = (mz_zip_internal_state *)0x0;
    (paVar2->zip).m_pRead = (mz_file_read_func)0x0;
    (paVar2->zip).m_pWrite = (mz_file_write_func)0x0;
    (paVar2->zip).m_total_files = 0;
    (paVar2->zip).m_zip_mode = MZ_ZIP_MODE_INVALID;
    *(undefined8 *)&(paVar2->zip).m_file_offset_alignment = 0;
    (paVar2->zip).m_archive_size = 0;
    (paVar2->zip).m_central_directory_file_ofs = 0;
    (paVar2->zip).m_pAlloc = assetsys_internal_mz_alloc;
    (paVar2->zip).m_pRealloc = assetsys_internal_mz_realloc;
    (paVar2->zip).m_pFree = assetsys_internal_mz_free;
    (paVar2->zip).m_pAlloc_opaque = sys->memctx;
    mVar5 = mz_zip_reader_init_mem(pZip,zip_mem,zip_mem_size,0);
    if (mVar5 == 0) {
      free(paVar2->dirs);
      paVar10 = paVar2->files;
LAB_0017153b:
      free(paVar10);
      return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
    }
    mVar1 = (paVar2->zip).m_total_files;
    if (0 < (int)mVar1) {
      pcVar7 = sys->temp;
      pool = &sys->strpool;
      mVar13 = 0;
      do {
        mVar5 = mz_zip_reader_is_file_a_directory(pZip,mVar13);
        if (mVar5 != 0) {
          iVar4 = paVar2->dirs_count;
          iVar6 = paVar2->dirs_capacity;
          if (iVar6 <= iVar4) {
            paVar2->dirs_capacity = iVar6 * 2;
            __dest_00 = (assetsys_internal_folder_t *)malloc((long)iVar6 << 3);
            paVar11 = paVar2->dirs;
            memcpy(__dest_00,paVar11,(long)iVar4 << 2);
            free(paVar11);
            paVar2->dirs = __dest_00;
          }
          mz_zip_reader_get_filename(pZip,mVar13,(char *)&local_438,0x400);
          paVar11 = paVar2->dirs;
          iVar4 = paVar2->dirs_count;
          paVar2->dirs_count = iVar4 + 1;
          psVar12 = strpool_internal_get_entry(pool,paVar2->mounted_as);
          strcpy(pcVar7,psVar12->data + 8);
          sVar8 = strlen(pcVar7);
          (sys->temp + sVar8)[0] = '/';
          (sys->temp + sVar8)[1] = '\0';
          strcat(pcVar7,(char *)&local_438);
          sVar8 = strlen(pcVar7);
          sys->temp[sVar8 - 1] = '\0';
          iVar6 = assetsys_internal_register_collated(sys,pcVar7,0);
          paVar11[iVar4].collated_index = iVar6;
        }
        mVar13 = mVar13 + 1;
      } while (mVar1 != mVar13);
      if (0 < (int)mVar1) {
        mVar13 = 0;
        do {
          mVar5 = mz_zip_reader_is_file_a_directory(pZip,mVar13);
          if (mVar5 == 0) {
            iVar4 = paVar2->files_count;
            iVar6 = paVar2->files_capacity;
            if (iVar6 <= iVar4) {
              paVar2->files_capacity = iVar6 * 2;
              __dest_01 = (assetsys_internal_file_t *)malloc((long)iVar6 * 0x18);
              paVar10 = paVar2->files;
              memcpy(__dest_01,paVar10,(long)iVar4 * 0xc);
              free(paVar10);
              paVar2->files = __dest_01;
            }
            mVar5 = mz_zip_reader_file_stat(pZip,mVar13,&local_438);
            if (mVar5 == 0) {
              mz_zip_reader_end(pZip);
              free(paVar2->dirs);
              paVar10 = paVar2->files;
              goto LAB_0017153b;
            }
            paVar10 = paVar2->files;
            iVar4 = paVar2->files_count;
            paVar2->files_count = iVar4 + 1;
            psVar12 = strpool_internal_get_entry(pool,paVar2->mounted_as);
            strcpy(pcVar7,psVar12->data + 8);
            sVar8 = strlen(pcVar7);
            (sys->temp + sVar8)[0] = '/';
            (sys->temp + sVar8)[1] = '\0';
            strcat(pcVar7,local_438.m_filename);
            iVar6 = assetsys_internal_register_collated(sys,pcVar7,1);
            paVar10[iVar4].collated_index = iVar6;
            paVar10[iVar4].size = (int)local_438.m_uncomp_size;
            paVar10[iVar4].zip_index = mVar13;
            assetsys_internal_dirname(pcVar7);
            sVar8 = strlen(assetsys_internal_dirname::result);
            uVar9 = strpool_inject(pool,assetsys_internal_dirname::result,(int)sVar8 + -1);
            lVar15 = (long)paVar2->dirs_count;
            if (0 < lVar15) {
              lVar14 = 0;
              bVar3 = false;
              do {
                if (uVar9 == sys->collated[paVar2->dirs[lVar14].collated_index].path) {
                  bVar3 = true;
                }
                lVar14 = lVar14 + 1;
              } while (lVar15 != lVar14);
              if (bVar3) goto LAB_0017151a;
            }
            paVar11 = paVar2->dirs;
            paVar2->dirs_count = paVar2->dirs_count + 1;
            psVar12 = strpool_internal_get_entry(pool,uVar9);
            if (psVar12 == (strpool_internal_entry_t *)0x0) {
              path_00 = (char *)0x0;
            }
            else {
              path_00 = psVar12->data + 8;
            }
            iVar4 = assetsys_internal_register_collated(sys,path_00,0);
            paVar11[lVar15].collated_index = iVar4;
          }
LAB_0017151a:
          mVar13 = mVar13 + 1;
        } while (mVar13 != mVar1);
      }
    }
  }
  assetsys_internal_collate_directories(sys,paVar2);
  sys->mounts_count = sys->mounts_count + 1;
  return ASSETSYS_SUCCESS;
}

Assistant:

assetsys_error_t assetsys_mount( assetsys_t* sys, char const* path, const char *zip_mem, size_t zip_mem_size, char const* mount_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mount_as ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( strchr( path, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, ':' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    int len = (int) strlen( path );
    if( len > 0 && path[ 0 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;       
    if( len > 1 && path[ len - 1 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;     
    int mount_len = (int) strlen( mount_as );
    if( mount_len == 0 || mount_as[ 0 ] != '/' || ( mount_len > 1 && mount_as[ mount_len - 1 ] == '/' ) ) 
        return ASSETSYS_ERROR_INVALID_PATH;     
    
    enum assetsys_internal_mount_type_t type;

    if (!zip_mem) 
    {
    #if defined( _MSC_VER ) && _MSC_VER >= 1400
        struct _stat64 s;
        int res = __stat64( *path == '\0' ? "." : path, &s );
    #else
        struct stat s;
        int res = stat( *path == '\0' ? "." : path, &s );
    #endif
    if( res == 0 )
        {
        if( s.st_mode & S_IFDIR ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
        else if( s.st_mode & S_IFREG ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
        else return ASSETSYS_ERROR_INVALID_PATH;
        }
    else
        {
        return ASSETSYS_ERROR_INVALID_PATH;
        }
    }
    else 
    {
        type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
    }

    if( sys->mounts_count >= sys->mounts_capacity )
        {
        sys->mounts_capacity *= 2;
        struct assetsys_internal_mount_t* new_mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( sys->memctx, 
            sizeof( *sys->mounts ) * sys->mounts_capacity );
        memcpy( new_mounts, sys->mounts, sizeof( *sys->mounts ) * sys->mounts_count );
        ASSETSYS_FREE( sys->memctx, sys->mounts );
        sys->mounts = new_mounts;
        }

    struct assetsys_internal_mount_t* mount = &sys->mounts[ sys->mounts_count ];

    mount->mounted_as = assetsys_internal_add_string( sys, mount_as ? mount_as : "" );
    mount->mount_len = mount_as ? (int) strlen( mount_as ) : 0;
    mount->path = assetsys_internal_add_string( sys, path );
    mount->type = type;
        
    mount->files_count = 0;
    mount->files_capacity = 4096;
    mount->files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->files) ) * mount->files_capacity );

    mount->dirs_count = 0;
    mount->dirs_capacity = 1024;
    mount->dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->dirs) ) * mount->dirs_capacity );

    struct assetsys_internal_folder_t* dir = &mount->dirs[ mount->dirs_count++ ];
    dir->collated_index = assetsys_internal_register_collated( sys, mount_as, 0 );
    
    if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        assetsys_internal_recurse_directories( sys, dir->collated_index, mount );
        }
    else if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        memset( &mount->zip, 0, sizeof( mount->zip ) );
        mount->zip.m_pAlloc = assetsys_internal_mz_alloc;
        mount->zip.m_pRealloc = assetsys_internal_mz_realloc;
        mount->zip.m_pFree = assetsys_internal_mz_free;
        mount->zip.m_pAlloc_opaque = sys->memctx;
        //mz_bool status = mz_zip_reader_init_file( &mount->zip, path, 0 );
        mz_bool status = mz_zip_reader_init_mem( &mount->zip, zip_mem, zip_mem_size, 0 );
        if( !status )
            {
            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );
            return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
            }

        int count = (int) mz_zip_reader_get_num_files( &mount->zip );

        for( int i = 0; i < count; ++i )
            {
            if( mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->dirs_count >= mount->dirs_capacity )
                    {
                    mount->dirs_capacity *= 2;
                    struct assetsys_internal_folder_t* new_dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->dirs) ) * mount->dirs_capacity );
                    memcpy( new_dirs, mount->dirs, sizeof( *(mount->dirs) ) * mount->dirs_count );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    mount->dirs = new_dirs;
                    }

                char filename[ 1024 ];                
                mz_zip_reader_get_filename( &mount->zip, (mz_uint) i, filename, sizeof( filename ) );

                struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, filename );
                sys->temp[ strlen( sys->temp )  - 1 ] = '\0';
                as_dir->collated_index = assetsys_internal_register_collated( sys, sys->temp, 0 );
                }
            }

        for( int i = 0; i < count; ++i )
            {
            if( !mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->files_count >= mount->files_capacity )
                    {
                    mount->files_capacity *= 2;
                    struct assetsys_internal_file_t* new_files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->files) ) * mount->files_capacity );
                    memcpy( new_files, mount->files, sizeof( *(mount->files) ) * mount->files_count );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    mount->files = new_files;
                    }

                mz_zip_archive_file_stat stat;
                mz_bool result = mz_zip_reader_file_stat( &mount->zip, (mz_uint) i, &stat);
                if( !result )
                    {
                    mz_zip_reader_end( &mount->zip );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                    }

                struct assetsys_internal_file_t* file = &mount->files[ mount->files_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, stat.m_filename );
                file->collated_index = assetsys_internal_register_collated( sys, sys->temp, 1 );
                file->size = (int) stat.m_uncomp_size;
                file->zip_index = i;

                char* dir_path = assetsys_internal_dirname( sys->temp );
                ASSETSYS_U64 handle = strpool_inject( &sys->strpool, dir_path, (int) strlen( dir_path ) - 1 );               
                int found = 0;
                for( int j = 0; j < mount->dirs_count; ++j )
                    {
                    if( handle == sys->collated[ mount->dirs[ j ].collated_index ].path )
                        found = 1;
                    }
                if( !found ) 
                    {
                    struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                    as_dir->collated_index = assetsys_internal_register_collated( sys, 
                        assetsys_internal_get_string( sys, handle ), 0 );
                    }
                }
            }
        }
        

    assetsys_internal_collate_directories( sys, mount );

    ++sys->mounts_count;
    return ASSETSYS_SUCCESS;
    }